

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O0

void __thiscall
message_test_should_create_repeating_group_Test::TestBody
          (message_test_should_create_repeating_group_Test *this)

{
  bool bVar1;
  Type *pTVar2;
  char *pcVar3;
  Type *pTVar4;
  type_by_index_t<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *ptVar5;
  type_by_index_t<1UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *ptVar6;
  char *in_R9;
  AssertHelper local_12e0;
  Message local_12d8;
  char local_12c9;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar_10;
  Message local_12b0;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar_9;
  Message local_1290;
  char local_1281;
  undefined1 local_1280 [8];
  AssertionResult gtest_ar_8;
  Message local_1268;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar_7;
  Message local_1248;
  int local_123c;
  unsigned_long local_1238;
  undefined1 local_1230 [8];
  AssertionResult gtest_ar_6;
  Type *groupValues;
  Message local_1210;
  int local_1204;
  size_t local_1200;
  undefined1 local_11f8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_11c8;
  Message local_11c0;
  bool local_11b1;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar_;
  type_by_index_t<6UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  *repeatingGroup;
  Fields *values;
  Message local_1188;
  int local_117c;
  size_t local_1178;
  undefined1 local_1170 [8];
  AssertionResult gtest_ar_4;
  Message local_1158;
  char local_1149;
  undefined1 local_1148 [8];
  AssertionResult gtest_ar_3;
  Message local_1130;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1110;
  Message local_1108;
  char local_10f9;
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_10e0;
  Message local_10d8;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_10b8 [8];
  Instance instance;
  FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  local_f60;
  FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  group;
  Logon logon;
  message_test_should_create_repeating_group_Test *this_local;
  
  Fixpp::
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  ::VersionnedMessage((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       *)&group);
  local_f60 = Fixpp::
              createGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                        ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                          *)&group,2);
  Fixpp::
  FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  ::instance((Instance *)local_10b8,&local_f60);
  Fixpp::
  set<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char_const(&)[5]>
            ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              *)local_10b8,(char (*) [5])"TEST");
  gtest_ar.message_.ptr_._7_1_ = 0x53;
  Fixpp::
  set<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char>
            ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              *)local_10b8,(char *)((long)&gtest_ar.message_.ptr_ + 7));
  pTVar2 = Fixpp::
           get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                     ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       *)local_10b8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
            ((EqHelper<false> *)local_10d0,"Fixpp::get<Tag::RefMsgType>(instance)","\"TEST\"",pTVar2
             ,(char (*) [5])"TEST");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar1) {
    testing::Message::Message(&local_10d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_10e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10e0,&local_10d8);
    testing::internal::AssertHelper::~AssertHelper(&local_10e0);
    testing::Message::~Message(&local_10d8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    pTVar4 = Fixpp::
             get<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                       ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         *)local_10b8);
    local_10f9 = 'S';
    testing::internal::EqHelper<false>::Compare<char,char>
              ((EqHelper<false> *)local_10f8,"Fixpp::get<Tag::MsgDirection>(instance)","\'S\'",
               pTVar4,&local_10f9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
    if (!bVar1) {
      testing::Message::Message(&local_1108);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10f8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1110,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                 ,0x31,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1110,&local_1108);
      testing::internal::AssertHelper::~AssertHelper(&local_1110);
      testing::Message::~Message(&local_1108);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      Fixpp::
      FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
      ::add(&local_f60,(Instance *)local_10b8);
      Fixpp::
      set<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char_const(&)[3]>
                ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  *)local_10b8,(char (*) [3])"MD");
      gtest_ar_2.message_.ptr_._7_1_ = 0x53;
      Fixpp::
      set<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char>
                ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  *)local_10b8,(char *)((long)&gtest_ar_2.message_.ptr_ + 7));
      pTVar2 = Fixpp::
               get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                         ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                           *)local_10b8);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
                ((EqHelper<false> *)local_1128,"Fixpp::get<Tag::RefMsgType>(instance)","\"MD\"",
                 pTVar2,(char (*) [3])"MD");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
      if (!bVar1) {
        testing::Message::Message(&local_1130);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                   ,0x38,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1130)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1130);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        pTVar4 = Fixpp::
                 get<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                           ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             *)local_10b8);
        local_1149 = 'S';
        testing::internal::EqHelper<false>::Compare<char,char>
                  ((EqHelper<false> *)local_1148,"Fixpp::get<Tag::MsgDirection>(instance)","\'S\'",
                   pTVar4,&local_1149);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1148);
        if (!bVar1) {
          testing::Message::Message(&local_1158);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1148);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                     ,0x39,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_1158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_1158);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1148);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          Fixpp::
          FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
          ::add(&local_f60,(Instance *)local_10b8);
          local_1178 = Fixpp::
                       FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       ::size(&local_f60);
          local_117c = 2;
          testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                    ((EqHelper<false> *)local_1170,"group.size()","2",&local_1178,&local_117c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1170);
          if (!bVar1) {
            testing::Message::Message(&local_1188);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1170);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&values,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                       ,0x3d,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&values,&local_1188);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&values);
            testing::Message::~Message(&local_1188);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1170);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 meta::
                 get<6ul,Fixpp::Field<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<141u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<383u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                           ((tuple<Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                             *)&group);
            bVar1 = Fixpp::
                    Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                    ::empty((Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             *)gtest_ar_.message_.ptr_);
            local_11b1 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_11b0,&local_11b1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b0);
            if (!bVar1) {
              testing::Message::Message(&local_11c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_5.message_,(internal *)local_11b0,
                         (AssertionResult *)"repeatingGroup.empty()","true","false",in_R9);
              pcVar3 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&gtest_ar_5.message_);
              testing::internal::AssertHelper::AssertHelper
                        (&local_11c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                         ,0x45,pcVar3);
              testing::internal::AssertHelper::operator=(&local_11c8,&local_11c0);
              testing::internal::AssertHelper::~AssertHelper(&local_11c8);
              std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_11c0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b0);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              local_1200 = Fixpp::
                           Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                           ::size((Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                   *)gtest_ar_.message_.ptr_);
              local_1204 = 2;
              testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                        ((EqHelper<false> *)local_11f8,"repeatingGroup.size()","2",&local_1200,
                         &local_1204);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f8)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_1210);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&groupValues,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                           ,0x46,pcVar3);
                testing::internal::AssertHelper::operator=((AssertHelper *)&groupValues,&local_1210)
                ;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&groupValues);
                testing::Message::~Message(&local_1210);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f8);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                gtest_ar_6.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Fixpp::
                     Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                     ::get(gtest_ar_.message_.ptr_);
                local_1238 = ((long)(((Type *)gtest_ar_6.message_.ptr_)->
                                    super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                                    ).
                                    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                    .
                                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                                    .super_SmallVectorBase.EndX -
                             (long)(((Type *)gtest_ar_6.message_.ptr_)->
                                   super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                                   ).
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                   .
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                                   .super_SmallVectorBase.BeginX) / 0x148;
                local_123c = 2;
                testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                          ((EqHelper<false> *)local_1230,"groupValues.size()","2",&local_1238,
                           &local_123c);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1230);
                if (!bVar1) {
                  testing::Message::Message(&local_1248);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1230);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                             ,0x49,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_7.message_,&local_1248);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_);
                  testing::Message::~Message(&local_1248);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1230);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  if ((long)((gtest_ar_6.message_.ptr_)->_M_string_length -
                            (long)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p) / 0x148 == 0) {
                    __assert_fail("idx < size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                  ,0x187,
                                  "const_reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) const [T = Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                                 );
                  }
                  ptVar5 = meta::
                           get<0ul,Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                                     ((tuple<Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                       *)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p);
                  pTVar2 = Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>::get_abi_cxx11_
                                     ((Field<Fixpp::TagT<372u,Fixpp::Type::String>> *)ptVar5);
                  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
                            ((EqHelper<false> *)local_1260,
                             "meta::get<0>(groupValues[0].values).get()","\"TEST\"",pTVar2,
                             (char (*) [5])"TEST");
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_1260);
                  if (!bVar1) {
                    testing::Message::Message(&local_1268);
                    pcVar3 = testing::AssertionResult::failure_message
                                       ((AssertionResult *)local_1260);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                               ,0x4b,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_8.message_,&local_1268);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_);
                    testing::Message::~Message(&local_1268);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1260);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    if ((long)((gtest_ar_6.message_.ptr_)->_M_string_length -
                              (long)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p) / 0x148 == 0) {
                      __assert_fail("idx < size()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                    ,0x187,
                                    "const_reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) const [T = Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                                   );
                    }
                    ptVar6 = meta::
                             get<1ul,Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                                       ((tuple<Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                         *)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p);
                    pTVar4 = Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>::get(ptVar6);
                    local_1281 = 'S';
                    testing::internal::EqHelper<false>::Compare<char,char>
                              ((EqHelper<false> *)local_1280,
                               "meta::get<1>(groupValues[0].values).get()","\'S\'",pTVar4,
                               &local_1281);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1280);
                    if (!bVar1) {
                      testing::Message::Message(&local_1290);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1280);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                 ,0x4c,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_9.message_,&local_1290);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_9.message_);
                      testing::Message::~Message(&local_1290);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1280);
                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                      if ((ulong)((long)((gtest_ar_6.message_.ptr_)->_M_string_length -
                                        (long)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p) /
                                 0x148) < 2) {
                        __assert_fail("idx < size()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                      ,0x187,
                                      "const_reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) const [T = Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                                     );
                      }
                      ptVar5 = meta::
                               get<0ul,Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                                         ((tuple<Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                           *)(((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p + 0x148
                                             ));
                      pTVar2 = Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>::get_abi_cxx11_
                                         ((Field<Fixpp::TagT<372u,Fixpp::Type::String>> *)ptVar5);
                      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
                                ((EqHelper<false> *)local_12a8,
                                 "meta::get<0>(groupValues[1].values).get()","\"MD\"",pTVar2,
                                 (char (*) [3])"MD");
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_12a8);
                      if (!bVar1) {
                        testing::Message::Message(&local_12b0);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_12a8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                   ,0x4e,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_10.message_,&local_12b0);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_10.message_);
                        testing::Message::~Message(&local_12b0);
                      }
                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a8);
                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                        if ((ulong)((long)((gtest_ar_6.message_.ptr_)->_M_string_length -
                                          (long)((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p) /
                                   0x148) < 2) {
                          __assert_fail("idx < size()",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                        ,0x187,
                                        "const_reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) const [T = Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                                       );
                        }
                        ptVar6 = meta::
                                 get<1ul,Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                                           ((tuple<Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                             *)(((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p +
                                               0x148));
                        pTVar4 = Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>::get(ptVar6);
                        local_12c9 = 'S';
                        testing::internal::EqHelper<false>::Compare<char,char>
                                  ((EqHelper<false> *)local_12c8,
                                   "meta::get<1>(groupValues[1].values).get()","\'S\'",pTVar4,
                                   &local_12c9);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_12c8);
                        if (!bVar1) {
                          testing::Message::Message(&local_12d8);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_12c8);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_12e0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                     ,0x4f,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_12e0,&local_12d8);
                          testing::internal::AssertHelper::~AssertHelper(&local_12e0);
                          testing::Message::~Message(&local_12d8);
                        }
                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                          gtest_ar_1.message_.ptr_._4_4_ = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Fixpp::
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  ::~InstanceGroup((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                    *)local_10b8);
  Fixpp::
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  ::~VersionnedMessage
            ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              *)&group);
  return;
}

Assistant:

TEST(message_test, should_create_repeating_group)
{
    Fixpp::v42::Message::Logon logon;

    using namespace Fixpp;

    // First, we create a new group and add 2 instances

    auto group = Fixpp::createGroup<Tag::NoMsgTypes>(logon, 2);
    auto instance = group.instance();

    Fixpp::set<Tag::RefMsgType>(instance, "TEST");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "TEST");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    Fixpp::set<Tag::RefMsgType>(instance, "MD");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "MD");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    ASSERT_EQ(group.size(), 2);

    // Let's now check that values have been written in the message itself
    auto& values = logon.values;

    // NoMsgTypes RepeatinGroup is the 7th field in the Logon message
    auto& repeatingGroup = meta::get<6>(values);

    ASSERT_FALSE(repeatingGroup.empty());
    ASSERT_EQ(repeatingGroup.size(), 2);

    const auto& groupValues = repeatingGroup.get();
    ASSERT_EQ(groupValues.size(), 2);

    ASSERT_EQ(meta::get<0>(groupValues[0].values).get(), "TEST");
    ASSERT_EQ(meta::get<1>(groupValues[0].values).get(), 'S');

    ASSERT_EQ(meta::get<0>(groupValues[1].values).get(), "MD");
    ASSERT_EQ(meta::get<1>(groupValues[1].values).get(), 'S');
}